

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,GlobalName *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string_view s;
  char __rhs;
  size_type sVar1;
  mapped_type *this_00;
  undefined1 local_38 [8];
  string mangled;
  GlobalName *name_local;
  CWriter *this_local;
  
  __lhs = name->name;
  mangled.field_2._8_8_ = name;
  __rhs = MangleField(name->type);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,__lhs
                 ,__rhs);
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(&this->global_sym_map_,(key_type *)local_38);
  if (sVar1 == 1) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at(&this->global_sym_map_,(key_type *)local_38);
    s = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    Write(this,s);
    std::__cxx11::string::~string((string *)local_38);
    return;
  }
  __assert_fail("global_sym_map_.count(mangled) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                ,0x3bf,"void wabt::(anonymous namespace)::CWriter::Write(const GlobalName &)");
}

Assistant:

void CWriter::Write(const GlobalName& name) {
  std::string mangled = name.name + MangleField(name.type);
  assert(global_sym_map_.count(mangled) == 1);
  Write(global_sym_map_.at(mangled));
}